

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::setRotation(QGraphicsItem *this,qreal angle)

{
  TransformData *pTVar1;
  ulong uVar2;
  long lVar3;
  qreal *pqVar4;
  TransformData *pTVar5;
  QGraphicsItemPrivate *pQVar6;
  long in_FS_OFFSET;
  byte bVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double local_90;
  QVariant local_88;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  bVar7 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  prepareGeometryChange(this);
  pQVar6 = (this->d_ptr).d;
  local_90 = angle;
  if ((pQVar6->field_0x165 & 8) != 0) {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant(&local_68,angle);
    (*this->_vptr_QGraphicsItem[0x21])(&local_48,this,0x1c,&local_68);
    ::QVariant::~QVariant(&local_68);
    local_90 = (double)::QVariant::toReal((bool *)local_48.data);
    ::QVariant::~QVariant((QVariant *)&local_48);
    pQVar6 = (this->d_ptr).d;
  }
  pTVar1 = pQVar6->transformData;
  if (pTVar1 == (TransformData *)0x0) {
    pTVar1 = (TransformData *)operator_new(0x90);
    pqVar4 = (qreal *)&DAT_006777b8;
    pTVar5 = pTVar1;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pTVar5->transform).m_matrix[0][0] = *pqVar4;
      pqVar4 = pqVar4 + (ulong)bVar7 * -2 + 1;
      pTVar5 = (TransformData *)((long)pTVar5 + (ulong)bVar7 * -0x10 + 8);
    }
    *(undefined2 *)&(pTVar1->transform).field_0x48 = 0;
    pTVar1->scale = 1.0;
    pTVar1->rotation = 0.0;
    pTVar1->xOrigin = 0.0;
    pTVar1->yOrigin = 0.0;
    (pTVar1->graphicsTransforms).d.d = (Data *)0x0;
    (pTVar1->graphicsTransforms).d.ptr = (QGraphicsTransform **)0x0;
    (pTVar1->graphicsTransforms).d.size = 0;
    pTVar1->onlyTransform = true;
    pQVar6->transformData = pTVar1;
    uVar8 = 0;
    uVar9 = 0;
  }
  else {
    uVar8 = SUB84(pTVar1->rotation,0);
    uVar9 = (undefined4)((ulong)pTVar1->rotation >> 0x20);
  }
  if (((double)CONCAT44(uVar9,uVar8) != local_90) ||
     (NAN((double)CONCAT44(uVar9,uVar8)) || NAN(local_90))) {
    pTVar1->rotation = local_90;
    pTVar1->onlyTransform = false;
    pQVar6->field_0x166 = pQVar6->field_0x166 | 0x20;
    pQVar6 = (this->d_ptr).d;
    uVar2 = *(ulong *)&pQVar6->field_0x160;
    if ((uVar2 & 0x80000000000) != 0) {
      ::QVariant::QVariant((QVariant *)&local_48,local_90);
      (*this->_vptr_QGraphicsItem[0x21])(&local_88,this,0x1d,&local_48);
      ::QVariant::~QVariant(&local_88);
      ::QVariant::~QVariant((QVariant *)&local_48);
      pQVar6 = (this->d_ptr).d;
      uVar2 = *(ulong *)&pQVar6->field_0x160;
    }
    if ((uVar2 >> 0x38 & 1) != 0) {
      QGraphicsObject::rotationChanged((QGraphicsObject *)(this + -1));
      pQVar6 = (this->d_ptr).d;
    }
    (*pQVar6->_vptr_QGraphicsItemPrivate[4])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setRotation(qreal angle)
{
    prepareGeometryChange();
    qreal newRotation = angle;

    if (d_ptr->flags & ItemSendsGeometryChanges) {
        // Notify the item that the rotation is changing.
        const QVariant newRotationVariant(itemChange(ItemRotationChange, angle));
        newRotation = newRotationVariant.toReal();
    }

    if (!d_ptr->transformData)
        d_ptr->transformData = new QGraphicsItemPrivate::TransformData;

    if (d_ptr->transformData->rotation == newRotation)
        return;

    d_ptr->transformData->rotation = newRotation;
    d_ptr->transformData->onlyTransform = false;
    d_ptr->dirtySceneTransform = 1;

    // Send post-notification.
    if (d_ptr->flags & ItemSendsGeometryChanges)
        itemChange(ItemRotationHasChanged, newRotation);

    if (d_ptr->isObject)
        emit static_cast<QGraphicsObject *>(this)->rotationChanged();

    d_ptr->transformChanged();
}